

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_lookup.cpp
# Opt level: O0

ON__UINT64 __thiscall
ON_SN_BLOCK::ActiveElementEstimate(ON_SN_BLOCK *this,ON__UINT64 sn0,ON__UINT64 sn1)

{
  ulong uVar1;
  ulong local_28;
  ON__UINT64 c;
  ON__UINT64 sn1_local;
  ON__UINT64 sn0_local;
  ON_SN_BLOCK *this_local;
  
  local_28 = (ulong)(this->m_count - this->m_purged);
  if (local_28 != 0) {
    sn1_local = sn0;
    if (sn0 < this->m_sn0) {
      sn1_local = this->m_sn0;
    }
    c = sn1;
    if (this->m_sn1 < sn1) {
      c = this->m_sn1;
    }
    uVar1 = (c - sn1_local) + 1;
    if (uVar1 < local_28) {
      local_28 = uVar1;
    }
  }
  return local_28;
}

Assistant:

ON__UINT64 ON_SN_BLOCK::ActiveElementEstimate(ON__UINT64 sn0, ON__UINT64 sn1) const
{
  ON__UINT64 c = m_count-m_purged;
  if ( c > 0 )
  {
    if ( sn0 < m_sn0 )
      sn0 = m_sn0;
    if ( sn1 > m_sn1 )
      sn1 = m_sn1;
    sn1 -= sn0;
    sn1++;
    if (c > sn1)
      c = sn1;
  }
  return c;
}